

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.h
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
rlib::midi::inner::getVariableValue
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,uint64_t n)

{
  ulong in_RAX;
  undefined8 local_18;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = in_RAX;
  if ((n & 0xfe000000000000) != 0) {
    local_18._0_7_ = (undefined7)in_RAX;
    local_18 = CONCAT17((char)(n >> 0x31),(undefined7)local_18) | 0x8000000000000000;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,(uchar *)((long)&local_18 + 7));
  }
  if (((n & 0x1fc0000000000) != 0) ||
     ((__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_finish)) {
    local_18 = CONCAT17(local_18._7_1_,CONCAT16((char)(n >> 0x2a),(undefined6)local_18)) |
               0x80000000000000;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,(uchar *)((long)&local_18 + 6));
  }
  if (((n & 0x3f800000000) != 0) ||
     ((__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_finish)) {
    local_18 = CONCAT26(local_18._6_2_,CONCAT15((char)(n >> 0x23),(undefined5)local_18)) |
               0x800000000000;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,(uchar *)((long)&local_18 + 5));
  }
  if (((n & 0x7f0000000) != 0) ||
     ((__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_finish)) {
    local_18 = CONCAT35(local_18._5_3_,CONCAT14((char)(n >> 0x1c),(undefined4)local_18)) |
               0x8000000000;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,(uchar *)((long)&local_18 + 4));
  }
  if (((n & 0xfe00000) != 0) ||
     ((__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_finish)) {
    local_18 = CONCAT44(local_18._4_4_,CONCAT13((char)(n >> 0x15),(undefined3)local_18)) |
               0x80000000;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,(uchar *)((long)&local_18 + 3));
  }
  if (((n & 0x1fc000) != 0) ||
     ((__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_finish)) {
    local_18 = CONCAT53(local_18._3_5_,CONCAT12((char)(n >> 0xe),(undefined2)local_18)) | 0x800000;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,(uchar *)((long)&local_18 + 2));
  }
  if (((n & 0x3f80) != 0) ||
     ((__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_finish)) {
    local_18 = CONCAT62(local_18._2_6_,CONCAT11((char)(n >> 7),(uchar)local_18)) | 0x8000;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (__return_storage_ptr__,(uchar *)((long)&local_18 + 1));
  }
  local_18 = CONCAT71(local_18._1_7_,(char)n) & 0xffffffffffffff7f;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (__return_storage_ptr__,(uchar *)&local_18);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<uint8_t> getVariableValue(uint64_t n) {
			std::vector<uint8_t> v;
			VariableValue vv;
			vv.value = n;
			if (vv.b7) v.push_back(VariableByte(vv.b7, true).value);
			if (vv.b6 || !v.empty()) v.push_back(VariableByte(vv.b6, true).value);
			if (vv.b5 || !v.empty()) v.push_back(VariableByte(vv.b5, true).value);
			if (vv.b4 || !v.empty()) v.push_back(VariableByte(vv.b4, true).value);
			if (vv.b3 || !v.empty()) v.push_back(VariableByte(vv.b3, true).value);
			if (vv.b2 || !v.empty()) v.push_back(VariableByte(vv.b2, true).value);
			if (vv.b1 || !v.empty()) v.push_back(VariableByte(vv.b1, true).value);
			v.push_back(VariableByte(vv.b0, false).value);
			return v;
		}